

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPClause *this)

{
  string clause_string;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(this->kind) {
  case OMPC_if:
    break;
  case OMPC_num_threads:
    break;
  default:
    puts("The clause enum is not supported yet.");
    goto LAB_00178d20;
  case OMPC_private:
    break;
  case OMPC_firstprivate:
    break;
  case OMPC_shared:
    break;
  case OMPC_copyin:
    break;
  case OMPC_align:
    break;
  case OMPC_allocate:
    break;
  case OMPC_num_teams:
    break;
  case OMPC_thread_limit:
    break;
  case OMPC_collapse:
    break;
  case OMPC_ordered:
    break;
  case OMPC_partial:
    break;
  case OMPC_nowait:
    break;
  case OMPC_full:
    break;
  case OMPC_order:
    break;
  case OMPC_safelen:
    break;
  case OMPC_simdlen:
    break;
  case OMPC_nontemporal:
    break;
  case OMPC_uniform:
    break;
  case OMPC_inbranch:
    break;
  case OMPC_notinbranch:
    break;
  case OMPC_bind:
    break;
  case OMPC_inclusive:
    break;
  case OMPC_exclusive:
    break;
  case OMPC_copyprivate:
    break;
  case OMPC_parallel:
    break;
  case OMPC_sections:
    break;
  case OMPC_for:
    break;
  case OMPC_do:
    break;
  case OMPC_taskgroup:
    break;
  case OMPC_allocator:
    break;
  case OMPC_initializer:
    break;
  case OMPC_final:
    break;
  case OMPC_untied:
    break;
  case OMPC_mergeable:
    break;
  case OMPC_priority:
    break;
  case OMPC_detach:
    break;
  case OMPC_grainsize:
    break;
  case OMPC_num_tasks:
    break;
  case OMPC_nogroup:
    break;
  case OMPC_reverse_offload:
    break;
  case OMPC_unified_address:
    break;
  case OMPC_unified_shared_memory:
    break;
  case OMPC_dynamic_allocators:
    break;
  case OMPC_use_device_ptr:
    break;
  case OMPC_sizes:
    break;
  case OMPC_use_device_addr:
    break;
  case OMPC_is_device_ptr:
    break;
  case OMPC_has_device_addr:
    break;
  case OMPC_link:
    break;
  case OMPC_acq_rel:
    break;
  case OMPC_release:
    break;
  case OMPC_acquire:
    break;
  case OMPC_read:
    break;
  case OMPC_write:
    break;
  case OMPC_update:
    break;
  case OMPC_capture:
    break;
  case OMPC_seq_cst:
    break;
  case OMPC_relaxed:
    break;
  case OMPC_hint:
    break;
  case OMPC_destroy:
    break;
  case OMPC_threads:
    break;
  case OMPC_simd:
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00178d20:
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"(","");
  expressionToString_abi_cxx11_(&local_40,this);
  std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_60);
  if (3 < local_58) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPClause::toString() {

    std::string result;

    switch (this->getKind()) {
        case OMPC_allocate:
            result += "allocate ";
            break;
        case OMPC_allocator:
            result += "allocator ";
            break;
        case OMPC_private:
            result += "private ";
            break;
        case OMPC_firstprivate:
            result += "firstprivate ";
            break;
        case OMPC_shared:
            result += "shared ";
            break;
        case OMPC_num_teams:
            result += "num_teams ";
            break;
        case OMPC_num_threads:
            result += "num_threads ";
            break;
        case OMPC_thread_limit:
            result += "thread_limit ";;
            break;
        case OMPC_copyin:
            result += "copyin ";
            break;
        case OMPC_align:
            result += "align ";
            break;
        case OMPC_collapse:
            result += "collapse ";
            break;
        case OMPC_ordered:
            result += "ordered ";
            break;
        case OMPC_nowait:
            result += "nowait ";
            break;
        case OMPC_full:
            result += "full ";
            break;
        case OMPC_partial:
            result += "partial ";
            break;
        case OMPC_order:
            result += "order ";
            break;
        case OMPC_safelen:
            result += "safelen ";
            break;
        case OMPC_simdlen:
            result += "simdlen ";
            break;
        case OMPC_nontemporal:
            result += "nontemporal ";
            break;
        case OMPC_uniform:
            result += "uniform ";
            break;
        case OMPC_inbranch:
            result += "inbranch ";
            break;
        case OMPC_notinbranch:
            result += "notinbranch ";
            break;
        case OMPC_bind:
            result += "bind ";
            break; 
        case OMPC_inclusive:
            result += "inclusive ";
            break;        
        case OMPC_exclusive:
            result += "exclusive ";
            break;
        case OMPC_copyprivate:
            result += "copyprivate ";
            break;        
        case OMPC_parallel:
            result += "parallel ";
            break;
        case OMPC_sections:
            result += "sections ";
            break;
        case OMPC_initializer:
            result += "initializer ";
            break;
        case OMPC_for:
            result += "for ";
            break;
        case OMPC_do:
            result += "do ";
            break;
        case OMPC_taskgroup:
            result += "taskgroup ";
            break;
        case OMPC_if:
            result += "if ";
            break;
        case OMPC_final:
            result += "final ";
            break;
        case OMPC_untied:
            result += "untied ";
            break;
        case OMPC_mergeable:
            result += "mergeable ";
            break;
        case OMPC_priority:
            result += "priority ";
            break;
        case OMPC_detach:
            result += "detach ";
            break;
        case OMPC_reverse_offload:
            result += "reverse_offload ";
            break;
        case OMPC_unified_address:
            result += "unified_address ";
            break;
        case OMPC_unified_shared_memory:
            result += "unified_shared_memory ";
            break;
        case OMPC_dynamic_allocators:
            result += "dynamic_allocators ";
            break;
        case OMPC_use_device_ptr:
            result += "use_device_ptr ";
            break;
        case OMPC_sizes:
            result += "sizes ";
            break;
        case OMPC_use_device_addr:
            result += "use_device_addr ";
            break;
        case OMPC_is_device_ptr:
            result += "is_device_ptr ";
            break;
        case OMPC_has_device_addr:
            result += "has_device_addr ";
            break;
        case OMPC_grainsize:
            result += "grainsize ";
            break;
        case OMPC_num_tasks:
            result += "num_tasks ";
            break;
        case OMPC_nogroup:
            result += "nogroup ";
            break;
        case OMPC_link:
            result += "link ";
            break;
        case OMPC_acq_rel:
            result += "acq_rel ";
            break;
        case OMPC_release:
            result += "release ";
            break;
        case OMPC_acquire:
            result += "acquire ";
            break;
        case OMPC_read:
            result += "read ";
            break;
        case OMPC_write:
            result += "write ";
            break;
        case OMPC_update:
            result += "update ";
            break;
        case OMPC_capture:
            result += "capture ";
            break;
        case OMPC_seq_cst:
            result += "seq_cst ";
            break;
        case OMPC_relaxed:
            result += "relaxed ";
            break;
        case OMPC_hint:
            result += "hint ";
            break;
        case OMPC_threads:
            result += "threads ";
            break;
        case OMPC_simd:
            result += "simd ";
            break;
        case OMPC_destroy:
            result += "destroy ";
            break;
        default:
            printf("The clause enum is not supported yet.\n");
    }

    std::string clause_string = "(";
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    }

    return result;

}